

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Board *pBVar1;
  iterator __position;
  IBoard *pIVar2;
  iterator __position_00;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  Board *this;
  IBoard *this_00;
  long *plVar9;
  pointer plVar10;
  vector<ttt::Board,std::allocator<ttt::Board>> *this_01;
  vector<uttt::IBoard,std::allocator<uttt::IBoard>> *this_02;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  initializer_list<ttt::Board> __l;
  initializer_list<uttt::IBoard> __l_00;
  vector<long,_std::allocator<long>_> moves;
  long m;
  vector<ttt::Board,_std::allocator<ttt::Board>_> levels [2];
  int local_bc;
  undefined1 local_b0 [24];
  IBoard local_98;
  ulong local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [32];
  undefined8 uStack_48;
  undefined8 local_40;
  
  BoardTest<ttt::Board>();
  BoardTest<uttt::IBoard>();
  UtttHashTest();
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            (mcts::MCTS<ttt::Board,mcts::RandomPlayout<ttt::Board>>,100000);
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            (mcts::MCTS_parallel<ttt::Board,mcts::RandomPlayout<ttt::Board>>,100000);
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            (mcts::MCTS_cache<ttt::Board,mcts::RandomPlayout<ttt::Board>>,100000);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (mcts::MCTS<uttt::IBoard,uttt::RandomPlayout>,100000);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (mcts::MCTS_parallel<uttt::IBoard,uttt::RandomPlayout>,100000);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (mcts::MCTS_cache<uttt::IBoard,uttt::RandomPlayout>,100000);
  ManagerTest<ttt::Board,mcts::RandomPlayout<ttt::Board>>();
  ManagerTest<uttt::IBoard,uttt::RandomPlayout>();
  CountTest<ttt::Board>(10);
  CountTest<uttt::IBoard>(10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Game size: ",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes\n",7);
  ttt::Board::Board((Board *)local_b0);
  __l._M_len = 1;
  __l._M_array = (iterator)local_b0;
  std::vector<ttt::Board,_std::allocator<ttt::Board>_>::vector
            ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)local_68,__l,
             (allocator_type *)&local_98);
  local_68._24_8_ = 0;
  uStack_48 = 0;
  local_40 = 0;
  uVar5 = 0;
  local_bc = 0;
  while (local_bc != 10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Working on depth: ",0x12);
    local_bc = local_bc + 1;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_bc);
    local_b0[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_b0,1);
    local_80 = (ulong)(1 - uVar5);
    lVar8 = local_80 * 0x18;
    this_01 = (vector<ttt::Board,std::allocator<ttt::Board>> *)(local_68 + lVar8);
    if (*(long *)(local_68 + lVar8 + 8) != *(long *)this_01) {
      *(long *)(local_68 + lVar8 + 8) = *(long *)this_01;
    }
    local_78 = std::chrono::_V2::system_clock::now();
    pBVar1 = *(Board **)(local_68 + (ulong)uVar5 * 0x18 + 8);
    for (this = *(Board **)(local_68 + (ulong)uVar5 * 0x18); this != pBVar1; this = this + 1) {
      iVar4 = ttt::Board::GetStatus(this);
      if (iVar4 == -1) {
        ttt::Board::GetPossibleMoves((vector<long,_std::allocator<long>_> *)local_b0,this);
        uVar3 = local_b0._8_8_;
        for (plVar9 = (long *)CONCAT71(local_b0._1_7_,local_b0[0]); plVar9 != (long *)uVar3;
            plVar9 = plVar9 + 1) {
          local_70 = *plVar9;
          local_98.micro._M_elems[2] = *(short *)((this->board)._M_elems[2]._M_elems + 2);
          local_98._0_8_ = *(undefined8 *)(this->board)._M_elems;
          ttt::Board::ApplyMove((Board *)&local_98,&local_70);
          __position._M_current = *(Board **)(local_68 + lVar8 + 8);
          if (__position._M_current == *(Board **)(local_68 + lVar8 + 0x10)) {
            std::vector<ttt::Board,std::allocator<ttt::Board>>::_M_realloc_insert<ttt::Board&>
                      (this_01,__position,(Board *)&local_98);
          }
          else {
            *(short *)(((__position._M_current)->board)._M_elems[2]._M_elems + 2) =
                 local_98.micro._M_elems[2];
            *(undefined8 *)((__position._M_current)->board)._M_elems = local_98._0_8_;
            *(long *)(local_68 + lVar8 + 8) = *(long *)(local_68 + lVar8 + 8) + 10;
          }
        }
        if ((void *)CONCAT71(local_b0._1_7_,local_b0[0]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_b0._1_7_,local_b0[0]));
        }
      }
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    lVar7 = lVar7 - local_78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current depth count: ",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", size: ",8);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"MB\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total count: ",0xd);
    poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", size: ",8);
    poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," MB\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration: ",10);
    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," seconds ",9);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," milliseconds, ",0xf);
    lVar8 = (*(long *)(local_68 + lVar8 + 8) - *(long *)this_01 >> 1) * -0x3333333333333333;
    auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       ((((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                        (double)(lVar7 / 1000000)) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," nps\n",5);
    uVar5 = (uint)local_80;
  }
  lVar8 = 0x18;
  do {
    if (*(void **)(local_68 + lVar8) != (void *)0x0) {
      operator_delete(*(void **)(local_68 + lVar8));
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Game size: ",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes\n",7);
  uttt::IBoard::IBoard((IBoard *)local_b0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_b0;
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)local_68,__l_00,
             (allocator_type *)&local_98);
  local_68._24_8_ = 0;
  uStack_48 = 0;
  local_40 = 0;
  uVar5 = 0;
  local_bc = 0;
  while (local_bc != 10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Working on depth: ",0x12);
    local_bc = local_bc + 1;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_bc);
    local_b0[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_b0,1);
    local_80 = (ulong)(1 - uVar5);
    lVar8 = local_80 * 0x18;
    this_02 = (vector<uttt::IBoard,std::allocator<uttt::IBoard>> *)(local_68 + lVar8);
    if (*(long *)(local_68 + lVar8 + 8) != *(long *)this_02) {
      *(long *)(local_68 + lVar8 + 8) = *(long *)this_02;
    }
    local_78 = std::chrono::_V2::system_clock::now();
    pIVar2 = *(IBoard **)(local_68 + (ulong)uVar5 * 0x18 + 8);
    for (this_00 = *(IBoard **)(local_68 + (ulong)uVar5 * 0x18); this_00 != pIVar2;
        this_00 = this_00 + 1) {
      iVar4 = uttt::IBoard::GetStatus(this_00);
      if (iVar4 == -1) {
        uttt::IBoard::GetPossibleMoves((vector<long,_std::allocator<long>_> *)local_b0,this_00);
        uVar3 = local_b0._8_8_;
        for (plVar10 = (pointer)CONCAT71(local_b0._1_7_,local_b0[0]); plVar10 != (pointer)uVar3;
            plVar10 = plVar10 + 1) {
          local_70 = *plVar10;
          local_98._16_8_ = *(undefined8 *)((this_00->micro)._M_elems + 6);
          local_98.macro = this_00->macro;
          local_98.micro._M_elems[0] = (this_00->micro)._M_elems[0];
          local_98.micro._M_elems[1] = (this_00->micro)._M_elems[1];
          local_98.micro._M_elems._4_8_ = *(undefined8 *)((this_00->micro)._M_elems + 2);
          uttt::IBoard::ApplyMove(&local_98,&local_70);
          __position_00._M_current = *(IBoard **)(local_68 + lVar8 + 8);
          if (__position_00._M_current == *(IBoard **)(local_68 + lVar8 + 0x10)) {
            std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::_M_realloc_insert<uttt::IBoard&>
                      (this_02,__position_00,&local_98);
          }
          else {
            *(undefined8 *)(((__position_00._M_current)->micro)._M_elems + 6) = local_98._16_8_;
            (__position_00._M_current)->macro = local_98.macro;
            ((__position_00._M_current)->micro)._M_elems[0] = local_98.micro._M_elems[0];
            ((__position_00._M_current)->micro)._M_elems[1] = local_98.micro._M_elems[1];
            *(undefined8 *)(((__position_00._M_current)->micro)._M_elems + 2) =
                 local_98.micro._M_elems._4_8_;
            *(long *)(local_68 + lVar8 + 8) = *(long *)(local_68 + lVar8 + 8) + 0x18;
          }
        }
        if ((void *)CONCAT71(local_b0._1_7_,local_b0[0]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_b0._1_7_,local_b0[0]));
        }
      }
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    lVar7 = lVar7 - local_78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current depth count: ",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", size: ",8);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"MB\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total count: ",0xd);
    poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", size: ",8);
    poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," MB\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration: ",10);
    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," seconds ",9);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," milliseconds, ",0xf);
    lVar8 = (*(long *)(local_68 + lVar8 + 8) - *(long *)this_02 >> 3) * -0x5555555555555555;
    auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       ((((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                        (double)(lVar7 / 1000000)) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," nps\n",5);
    uVar5 = (uint)local_80;
  }
  lVar8 = 0x18;
  do {
    if (*(void **)(local_68 + lVar8) != (void *)0x0) {
      operator_delete(*(void **)(local_68 + lVar8));
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  BotTest<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>,ttt::Board>
            ();
  BotTest<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,uttt::Eval1>>,uttt::IBoard>
            ();
  CountUniqueBoardPositions<ttt::Board>(0x14);
  CountUniqueBoardPositions<uttt::IBoard>(0x14);
  local_68._0_8_ = (pointer)(local_68 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/mnt/e/uttt_data","");
  explorer::Explore<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>((string *)local_68);
  if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  ReaderWriterTest<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(10000000);
  return 0;
}

Assistant:

int main()
{
    BoardTest<ttt::Board>();
    BoardTest<uttt::IBoard>();

    UtttHashTest();

    MCTSTest<ttt::Board>(mcts::MCTS<ttt::Board>, 100000);
    MCTSTest<ttt::Board>(mcts::MCTS_parallel<ttt::Board>, 100000);
    MCTSTest<ttt::Board>(mcts::MCTS_cache<ttt::Board>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS<uttt::IBoard, uttt::RandomPlayout>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS_parallel<uttt::IBoard, uttt::RandomPlayout>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS_cache<uttt::IBoard, uttt::RandomPlayout>, 100000);

    ManagerTest<ttt::Board>();
    ManagerTest<uttt::IBoard, uttt::RandomPlayout>();

    CountTest<ttt::Board>(10);
    CountTest<uttt::IBoard>(10);
    CountBFS<ttt::Board>(10);
    CountBFS<uttt::IBoard>(10);

    BotTest<generic_bots::MinimaxBot<ttt::Board, minimax::ABeta<ttt::Board>>, ttt::Board>();
    BotTest<generic_bots::MinimaxBot<uttt::IBoard, minimax::ABeta<uttt::IBoard, uttt::Eval1>>, uttt::IBoard>();

    CountUniqueBoardPositions<ttt::Board>(20);
    CountUniqueBoardPositions<uttt::IBoard>(20);

    ExplorerTest<uttt::IBoard, uttt::IBoardReader, uttt::IBoardWriter, uttt::IBoardSize>("/mnt/e/uttt_data");
    ReaderWriterTest<uttt::IBoard, uttt::IBoardReader, uttt::IBoardWriter, uttt::IBoardSize>(10000000);
}